

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DPIFaultObject.cpp
# Opt level: O0

void __thiscall
eipScanner::vendor::ra::powerFlex525::DPIFaultObject::DPIFaultObject
          (DPIFaultObject *this,CipUint instanceId,SPtr *si)

{
  SPtr local_30;
  SPtr *local_20;
  SPtr *si_local;
  DPIFaultObject *pDStack_10;
  CipUint instanceId_local;
  DPIFaultObject *this_local;
  
  local_20 = si;
  si_local._6_2_ = instanceId;
  pDStack_10 = this;
  std::make_shared<eipScanner::MessageRouter>();
  DPIFaultObject(this,instanceId,si,&local_30);
  std::shared_ptr<eipScanner::MessageRouter>::~shared_ptr(&local_30);
  return;
}

Assistant:

DPIFaultObject::DPIFaultObject(CipUint instanceId, const SessionInfoIf::SPtr &si)
            : DPIFaultObject(instanceId, si, std::make_shared<MessageRouter>()) {

    }